

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O3

size_t luaO_str2num(char *s,TValue *o)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  char *pcVar5;
  size_t sVar6;
  lconv *plVar7;
  lu_byte lVar8;
  int iVar9;
  int mode;
  int mode_00;
  lua_Number lVar10;
  char cVar11;
  int iVar12;
  ulong uVar13;
  lua_Number n;
  lua_Number local_100;
  char local_f8 [216];
  
  pbVar4 = (byte *)s;
  do {
    pbVar3 = pbVar4;
    bVar1 = *pbVar3;
    uVar13 = (ulong)bVar1;
    pbVar4 = pbVar3 + 1;
  } while ((""[uVar13 + 1] & 8) != 0);
  if (bVar1 == 0x2b) {
    iVar9 = 0;
LAB_00147c92:
    uVar13 = (ulong)*pbVar4;
  }
  else {
    iVar9 = 1;
    if (bVar1 == 0x2d) goto LAB_00147c92;
    iVar9 = 0;
    pbVar4 = pbVar3;
  }
  if (((char)uVar13 == '0') && ((pbVar4[1] | 0x20) == 0x78)) {
    uVar13 = (ulong)pbVar4[2];
    pbVar4 = pbVar4 + 2;
    if ((""[uVar13 + 1] & 0x10) == 0) goto LAB_00147cfb;
    lVar10 = 0.0;
    do {
      cVar11 = (char)uVar13;
      if ((""[(long)cVar11 + 1] & 2) == 0) {
        iVar12 = ((int)cVar11 | 0x20U) - 0x57;
      }
      else {
        iVar12 = (int)cVar11 - 0x30;
      }
      lVar10 = (lua_Number)((long)iVar12 + (long)lVar10 * 0x10);
      uVar13 = (ulong)pbVar4[1];
      pbVar4 = pbVar4 + 1;
    } while ((""[uVar13 + 1] & 0x10) != 0);
LAB_00147d44:
    bVar2 = true;
  }
  else {
    if ((""[uVar13 + 1] & 2) != 0) {
      lVar10 = 0.0;
      do {
        iVar12 = (char)uVar13 + -0x30;
        if ((0xccccccccccccccb < (ulong)lVar10) &&
           ((lVar10 != 5.1488004017107686e-247 || (iVar9 + 7 < iVar12)))) goto LAB_00147d79;
        lVar10 = (lua_Number)((long)iVar12 + (long)lVar10 * 10);
        uVar13 = (ulong)pbVar4[1];
        pbVar4 = pbVar4 + 1;
      } while ((""[uVar13 + 1] & 2) != 0);
      goto LAB_00147d44;
    }
LAB_00147cfb:
    bVar2 = false;
    lVar10 = 0.0;
  }
  pbVar4 = pbVar4 + -1;
  do {
    pbVar3 = pbVar4 + 1;
    pbVar4 = pbVar4 + 1;
  } while ((""[(ulong)*pbVar3 + 1] & 8) != 0);
  if (bVar2 && *pbVar3 == 0) {
    local_100 = (lua_Number)-(long)lVar10;
    if (iVar9 == 0) {
      local_100 = lVar10;
    }
    lVar8 = '\x03';
LAB_00147db2:
    (o->value_).i = (lua_Integer)local_100;
    o->tt_ = lVar8;
    pbVar4 = pbVar4 + (1 - (long)s);
  }
  else {
LAB_00147d79:
    pbVar4 = (byte *)strpbrk(s,".xXnN");
    if ((pbVar4 == (byte *)0x0) || ((*pbVar4 & 0xdf) != 0x4e)) {
      pbVar4 = (byte *)l_str2dloc(s,&local_100,mode);
      if (pbVar4 != (byte *)0x0) {
LAB_00147dab:
        lVar8 = '\x13';
        goto LAB_00147db2;
      }
      pcVar5 = strchr(s,0x2e);
      if ((pcVar5 != (char *)0x0) && (sVar6 = strlen(s), sVar6 < 0xc9)) {
        strcpy(local_f8,s);
        plVar7 = localeconv();
        pcVar5[(long)(local_f8 + -(long)s)] = *plVar7->decimal_point;
        pcVar5 = l_str2dloc(local_f8,&local_100,mode_00);
        if (s != (char *)0x0 && pcVar5 != (char *)0x0) {
          pbVar4 = (byte *)(s + ((long)pcVar5 - (long)local_f8));
          goto LAB_00147dab;
        }
      }
    }
    pbVar4 = (byte *)0x0;
  }
  return (size_t)pbVar4;
}

Assistant:

size_t luaO_str2num (const char *s, TValue *o) {
  lua_Integer i; lua_Number n;
  const char *e;
  if ((e = l_str2int(s, &i)) != NULL) {  /* try as an integer */
    setivalue(o, i);
  }
  else if ((e = l_str2d(s, &n)) != NULL) {  /* else try as a float */
    setfltvalue(o, n);
  }
  else
    return 0;  /* conversion failed */
  return (e - s) + 1;  /* success; return string size */
}